

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset_container_benchmark.c
# Opt level: O0

void benchmark_logical_operations(void)

{
  int iVar1;
  float cycle_per_op_7;
  uint64_t S_7;
  timespec ts_15;
  timespec ts_14;
  int i_7;
  int wrong_answer_7;
  uint64_t min_diff_7;
  uint64_t cycles_diff_7;
  uint64_t cycles_final_7;
  uint64_t cycles_start_7;
  float cycle_per_op_6;
  uint64_t S_6;
  timespec ts_13;
  timespec ts_12;
  int i_6;
  int wrong_answer_6;
  uint64_t min_diff_6;
  uint64_t cycles_diff_6;
  uint64_t cycles_final_6;
  uint64_t cycles_start_6;
  float cycle_per_op_5;
  uint64_t S_5;
  timespec ts_11;
  timespec ts_10;
  int i_5;
  int wrong_answer_5;
  uint64_t min_diff_5;
  uint64_t cycles_diff_5;
  uint64_t cycles_final_5;
  uint64_t cycles_start_5;
  float cycle_per_op_4;
  uint64_t S_4;
  timespec ts_9;
  timespec ts_8;
  int i_4;
  int wrong_answer_4;
  uint64_t min_diff_4;
  uint64_t cycles_diff_4;
  uint64_t cycles_final_4;
  uint64_t cycles_start_4;
  int or_cardinality;
  float cycle_per_op_3;
  uint64_t S_3;
  timespec ts_7;
  timespec ts_6;
  int i_3;
  int wrong_answer_3;
  uint64_t min_diff_3;
  uint64_t cycles_diff_3;
  uint64_t cycles_final_3;
  uint64_t cycles_start_3;
  float cycle_per_op_2;
  uint64_t S_2;
  timespec ts_5;
  timespec ts_4;
  int i_2;
  int wrong_answer_2;
  uint64_t min_diff_2;
  uint64_t cycles_diff_2;
  uint64_t cycles_final_2;
  uint64_t cycles_start_2;
  float cycle_per_op_1;
  uint64_t S_1;
  timespec ts_3;
  timespec ts_2;
  int i_1;
  int wrong_answer_1;
  uint64_t min_diff_1;
  uint64_t cycles_diff_1;
  uint64_t cycles_final_1;
  uint64_t cycles_start_1;
  float cycle_per_op;
  uint64_t S;
  timespec ts_1;
  timespec ts;
  int i;
  int wrong_answer;
  uint64_t min_diff;
  uint64_t cycles_diff;
  uint64_t cycles_final;
  uint64_t cycles_start;
  int and_cardinality;
  bitset_container_t *BO;
  int x_1;
  bitset_container_t *B2;
  int x;
  bitset_container_t *B1;
  bitset_container_t *in_stack_fffffffffffffc68;
  undefined4 in_stack_fffffffffffffc70;
  undefined4 in_stack_fffffffffffffc74;
  undefined4 in_stack_fffffffffffffc78;
  undefined4 in_stack_fffffffffffffc7c;
  float local_37c;
  float local_368;
  float local_354;
  float local_340;
  float local_32c;
  float local_318;
  float local_304;
  float local_2f0;
  timespec local_2e0;
  timespec local_2d0;
  int local_2c0;
  int local_2bc;
  ulong local_2b8;
  ulong local_2b0;
  long local_2a8;
  long local_2a0;
  float local_294;
  undefined8 local_290;
  timespec local_288;
  timespec local_278;
  int local_268;
  int local_264;
  ulong local_260;
  ulong local_258;
  long local_250;
  long local_248;
  float local_23c;
  undefined8 local_238;
  timespec local_230;
  timespec local_220;
  int local_210;
  int local_20c;
  ulong local_208;
  ulong local_200;
  long local_1f8;
  long local_1f0;
  float local_1e4;
  undefined8 local_1e0;
  timespec local_1d8;
  timespec local_1c8;
  int local_1b8;
  int local_1b4;
  ulong local_1b0;
  ulong local_1a8;
  long local_1a0;
  long local_198;
  undefined4 local_190;
  float local_18c;
  undefined8 local_188;
  timespec local_180;
  timespec local_170;
  int local_160;
  int local_15c;
  ulong local_158;
  ulong local_150;
  long local_148;
  long local_140;
  float local_134;
  undefined8 local_130;
  timespec local_128;
  timespec local_118;
  int local_108;
  int local_104;
  ulong local_100;
  ulong local_f8;
  long local_f0;
  long local_e8;
  float local_dc;
  undefined8 local_d8;
  timespec local_d0;
  timespec local_c0;
  int local_b0;
  int local_ac;
  ulong local_a8;
  ulong local_a0;
  long local_98;
  long local_90;
  float local_84;
  undefined8 local_80;
  timespec local_78;
  timespec local_68;
  int local_58;
  int local_54;
  ulong local_50;
  ulong local_48;
  long local_40;
  long local_38;
  undefined4 local_2c;
  bitset_container_t *local_28;
  int local_1c;
  bitset_container_t *local_18;
  int local_c;
  bitset_container_t *local_8;
  
  printf("\nLogical operations (time units per single operation):\n");
  local_8 = bitset_container_create();
  for (local_c = 0; local_c < 0x10000; local_c = local_c + 3) {
    bitset_container_set(local_8,(uint16_t)local_c);
  }
  local_18 = bitset_container_create();
  for (local_1c = 0; local_1c < 0x10000; local_1c = local_1c + 5) {
    bitset_container_set(local_18,(uint16_t)local_1c);
  }
  local_28 = bitset_container_create();
  local_2c = 0x1112;
  printf("%s: ","bitset_container_and_nocard(B1, B2, BO)");
  fflush((FILE *)0x0);
  local_50 = 0xffffffffffffffff;
  local_54 = 0;
  for (local_58 = 0; local_58 < 500; local_58 = local_58 + 1) {
    clock_gettime(3,&local_68);
    local_38 = local_68.tv_sec * 1000000000 + local_68.tv_nsec;
    iVar1 = bitset_container_and_nocard
                      ((bitset_container_t *)
                       CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                       (bitset_container_t *)
                       CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                       in_stack_fffffffffffffc68);
    if (iVar1 != -1) {
      local_54 = 1;
    }
    clock_gettime(3,&local_78);
    local_40 = local_78.tv_sec * 1000000000 + local_78.tv_nsec;
    local_48 = local_40 - local_38;
    if (local_48 < local_50) {
      local_50 = local_48;
    }
  }
  local_80 = 1;
  local_2f0 = (float)local_50;
  local_84 = local_2f0 / 1.0;
  printf(" %.2f cycles per operation",(double)local_84);
  if (local_54 != 0) {
    printf(" [ERROR]");
  }
  printf("\n");
  fflush((FILE *)0x0);
  printf("%s: ","bitset_container_and(B1, B2, BO)");
  fflush((FILE *)0x0);
  local_a8 = 0xffffffffffffffff;
  local_ac = 0;
  for (local_b0 = 0; local_b0 < 500; local_b0 = local_b0 + 1) {
    clock_gettime(3,&local_c0);
    local_90 = local_c0.tv_sec * 1000000000 + local_c0.tv_nsec;
    iVar1 = bitset_container_and
                      ((bitset_container_t *)
                       CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                       (bitset_container_t *)
                       CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                       in_stack_fffffffffffffc68);
    if (iVar1 != 0x1112) {
      local_ac = 1;
    }
    clock_gettime(3,&local_d0);
    local_98 = local_d0.tv_sec * 1000000000 + local_d0.tv_nsec;
    local_a0 = local_98 - local_90;
    if (local_a0 < local_a8) {
      local_a8 = local_a0;
    }
  }
  local_d8 = 1;
  local_304 = (float)local_a8;
  local_dc = local_304 / 1.0;
  printf(" %.2f cycles per operation",(double)local_dc);
  if (local_ac != 0) {
    printf(" [ERROR]");
  }
  printf("\n");
  fflush((FILE *)0x0);
  printf("%s: ","bitset_container_and_justcard(B1, B2)");
  fflush((FILE *)0x0);
  local_100 = 0xffffffffffffffff;
  local_104 = 0;
  for (local_108 = 0; local_108 < 500; local_108 = local_108 + 1) {
    clock_gettime(3,&local_118);
    local_e8 = local_118.tv_sec * 1000000000 + local_118.tv_nsec;
    iVar1 = bitset_container_and_justcard
                      ((bitset_container_t *)
                       CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                       (bitset_container_t *)
                       CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
    if (iVar1 != 0x1112) {
      local_104 = 1;
    }
    clock_gettime(3,&local_128);
    local_f0 = local_128.tv_sec * 1000000000 + local_128.tv_nsec;
    local_f8 = local_f0 - local_e8;
    if (local_f8 < local_100) {
      local_100 = local_f8;
    }
  }
  local_130 = 1;
  local_318 = (float)local_100;
  local_134 = local_318 / 1.0;
  printf(" %.2f cycles per operation",(double)local_134);
  if (local_104 != 0) {
    printf(" [ERROR]");
  }
  printf("\n");
  fflush((FILE *)0x0);
  printf("%s: ","bitset_container_compute_cardinality(BO)");
  fflush((FILE *)0x0);
  local_158 = 0xffffffffffffffff;
  local_15c = 0;
  for (local_160 = 0; local_160 < 500; local_160 = local_160 + 1) {
    clock_gettime(3,&local_170);
    local_140 = local_170.tv_sec * 1000000000 + local_170.tv_nsec;
    iVar1 = bitset_container_compute_cardinality(in_stack_fffffffffffffc68);
    if (iVar1 != 0x1112) {
      local_15c = 1;
    }
    clock_gettime(3,&local_180);
    local_148 = local_180.tv_sec * 1000000000 + local_180.tv_nsec;
    local_150 = local_148 - local_140;
    if (local_150 < local_158) {
      local_158 = local_150;
    }
  }
  local_188 = 1;
  local_32c = (float)local_158;
  local_18c = local_32c / 1.0;
  printf(" %.2f cycles per operation",(double)local_18c);
  if (local_15c != 0) {
    printf(" [ERROR]");
  }
  printf("\n");
  fflush((FILE *)0x0);
  local_190 = 0x7778;
  printf("%s: ","bitset_container_or_nocard(B1, B2, BO)");
  fflush((FILE *)0x0);
  local_1b0 = 0xffffffffffffffff;
  local_1b4 = 0;
  for (local_1b8 = 0; local_1b8 < 500; local_1b8 = local_1b8 + 1) {
    clock_gettime(3,&local_1c8);
    local_198 = local_1c8.tv_sec * 1000000000 + local_1c8.tv_nsec;
    iVar1 = bitset_container_or_nocard
                      ((bitset_container_t *)
                       CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                       (bitset_container_t *)
                       CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                       in_stack_fffffffffffffc68);
    if (iVar1 != -1) {
      local_1b4 = 1;
    }
    clock_gettime(3,&local_1d8);
    local_1a0 = local_1d8.tv_sec * 1000000000 + local_1d8.tv_nsec;
    local_1a8 = local_1a0 - local_198;
    if (local_1a8 < local_1b0) {
      local_1b0 = local_1a8;
    }
  }
  local_1e0 = 1;
  local_340 = (float)local_1b0;
  local_1e4 = local_340 / 1.0;
  printf(" %.2f cycles per operation",(double)local_1e4);
  if (local_1b4 != 0) {
    printf(" [ERROR]");
  }
  printf("\n");
  fflush((FILE *)0x0);
  printf("%s: ","bitset_container_or(B1, B2, BO)");
  fflush((FILE *)0x0);
  local_208 = 0xffffffffffffffff;
  local_20c = 0;
  for (local_210 = 0; local_210 < 500; local_210 = local_210 + 1) {
    clock_gettime(3,&local_220);
    local_1f0 = local_220.tv_sec * 1000000000 + local_220.tv_nsec;
    iVar1 = bitset_container_or((bitset_container_t *)
                                CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                                (bitset_container_t *)
                                CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                                in_stack_fffffffffffffc68);
    if (iVar1 != 0x7778) {
      local_20c = 1;
    }
    clock_gettime(3,&local_230);
    local_1f8 = local_230.tv_sec * 1000000000 + local_230.tv_nsec;
    local_200 = local_1f8 - local_1f0;
    if (local_200 < local_208) {
      local_208 = local_200;
    }
  }
  local_238 = 1;
  local_354 = (float)local_208;
  local_23c = local_354 / 1.0;
  printf(" %.2f cycles per operation",(double)local_23c);
  if (local_20c != 0) {
    printf(" [ERROR]");
  }
  printf("\n");
  fflush((FILE *)0x0);
  printf("%s: ","bitset_container_or_justcard(B1, B2)");
  fflush((FILE *)0x0);
  local_260 = 0xffffffffffffffff;
  local_264 = 0;
  for (local_268 = 0; local_268 < 500; local_268 = local_268 + 1) {
    clock_gettime(3,&local_278);
    local_248 = local_278.tv_sec * 1000000000 + local_278.tv_nsec;
    iVar1 = bitset_container_or_justcard
                      ((bitset_container_t *)
                       CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                       (bitset_container_t *)
                       CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
    if (iVar1 != 0x7778) {
      local_264 = 1;
    }
    clock_gettime(3,&local_288);
    local_250 = local_288.tv_sec * 1000000000 + local_288.tv_nsec;
    local_258 = local_250 - local_248;
    if (local_258 < local_260) {
      local_260 = local_258;
    }
  }
  local_290 = 1;
  local_368 = (float)local_260;
  local_294 = local_368 / 1.0;
  printf(" %.2f cycles per operation",(double)local_294);
  if (local_264 != 0) {
    printf(" [ERROR]");
  }
  printf("\n");
  fflush((FILE *)0x0);
  printf("%s: ","bitset_container_compute_cardinality(BO)");
  fflush((FILE *)0x0);
  local_2b8 = 0xffffffffffffffff;
  local_2bc = 0;
  for (local_2c0 = 0; local_2c0 < 500; local_2c0 = local_2c0 + 1) {
    clock_gettime(3,&local_2d0);
    local_2a0 = local_2d0.tv_sec * 1000000000 + local_2d0.tv_nsec;
    iVar1 = bitset_container_compute_cardinality(in_stack_fffffffffffffc68);
    if (iVar1 != 0x7778) {
      local_2bc = 1;
    }
    clock_gettime(3,&local_2e0);
    local_2a8 = local_2e0.tv_sec * 1000000000 + local_2e0.tv_nsec;
    local_2b0 = local_2a8 - local_2a0;
    if (local_2b0 < local_2b8) {
      local_2b8 = local_2b0;
    }
  }
  local_37c = (float)local_2b8;
  printf(" %.2f cycles per operation",(double)(local_37c / 1.0));
  if (local_2bc != 0) {
    printf(" [ERROR]");
  }
  printf("\n");
  fflush((FILE *)0x0);
  bitset_container_free((bitset_container_t *)0x1027e4);
  bitset_container_free((bitset_container_t *)0x1027f1);
  bitset_container_free((bitset_container_t *)0x1027fe);
  printf("\n");
  return;
}

Assistant:

void benchmark_logical_operations() {
    printf("\nLogical operations (time units per single operation):\n");
    bitset_container_t* B1 = bitset_container_create();
    for (int x = 0; x < 1 << 16; x += 3) {
        bitset_container_set(B1, (uint16_t)x);
    }
    bitset_container_t* B2 = bitset_container_create();
    for (int x = 0; x < 1 << 16; x += 5) {
        bitset_container_set(B2, (uint16_t)x);
    }

    bitset_container_t* BO = bitset_container_create();

    const int and_cardinality = DIV_CEIL_64K(3 * 5);
    BEST_TIME(bitset_container_and_nocard(B1, B2, BO),
              BITSET_UNKNOWN_CARDINALITY, repeat, 1);
    BEST_TIME(bitset_container_and(B1, B2, BO), and_cardinality, repeat, 1);
    BEST_TIME(bitset_container_and_justcard(B1, B2), and_cardinality, repeat,
              1);
    BEST_TIME(bitset_container_compute_cardinality(BO), and_cardinality, repeat,
              1);

    const int or_cardinality =
        DIV_CEIL_64K(3) + DIV_CEIL_64K(5) - DIV_CEIL_64K(3 * 5);
    BEST_TIME(bitset_container_or_nocard(B1, B2, BO),
              BITSET_UNKNOWN_CARDINALITY, repeat, 1);
    BEST_TIME(bitset_container_or(B1, B2, BO), or_cardinality, repeat, 1);
    BEST_TIME(bitset_container_or_justcard(B1, B2), or_cardinality, repeat, 1);
    BEST_TIME(bitset_container_compute_cardinality(BO), or_cardinality, repeat,
              1);

    bitset_container_free(BO);
    bitset_container_free(B1);
    bitset_container_free(B2);
    printf("\n");
}